

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

String * __thiscall asl::String::trimmed(String *__return_storage_ptr__,String *this)

{
  byte bVar1;
  uint uVar2;
  anon_union_16_2_78e7fdac_for_String_2 *paVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  ulong uVar6;
  
  uVar2 = this->_len;
  uVar4 = (ulong)(int)uVar2;
  if (this->_size == 0) {
    paVar3 = &this->field_2;
  }
  else {
    paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->field_2)._str;
  }
  if ((long)uVar4 < 1) {
    uVar6 = 0;
  }
  else {
    uVar5 = 0;
    do {
      bVar1 = paVar3->_space[uVar5];
      uVar6 = uVar5;
      if (((' ' < (char)bVar1) || (0x20 < bVar1)) ||
         ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) break;
      uVar5 = uVar5 + 1;
      uVar6 = (ulong)uVar2;
    } while (uVar2 != uVar5);
  }
  i = (int)uVar6;
  if (i < (int)uVar2) {
    do {
      bVar1 = paVar3->_space[uVar4 - 1];
      if (((' ' < (char)bVar1) || (0x20 < bVar1)) ||
         ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) goto LAB_0011ab06;
      uVar4 = uVar4 - 1;
    } while ((long)i < (long)uVar4);
    uVar4 = uVar6 & 0xffffffff;
  }
LAB_0011ab06:
  substring(__return_storage_ptr__,this,i,(int)uVar4);
  return __return_storage_ptr__;
}

Assistant:

String String::trimmed() const
{
	int i,j, n=_len;
	const char* s = str();
	for(i=0; i<n; i++)
		if(!myisspace(s[i])) break;
	for(j=n-1; j>=i; j--)
		if(!myisspace(s[j])) break;
	return substring(i, j+1);
}